

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O1

uint32 __thiscall userinfo_t::ColorChanged(userinfo_t *this,char *colorname)

{
  FBaseCVar *this_00;
  Node *pNVar1;
  FName local_20;
  FName local_1c;
  
  local_20.Index = 0x204;
  pNVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::GetNode
                     (&this->
                       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      ,&local_20);
  this_00 = (pNVar1->Pair).Value;
  if (this_00 != (FBaseCVar *)0x0) {
    FBaseCVar::SetGenericRep(this_00,(UCVarValue)colorname,CVAR_String);
    local_1c.Index = 0x237;
    pNVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::GetNode
                       (&this->
                         super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        ,&local_1c);
    FBaseCVar::SetGenericRep((pNVar1->Pair).Value,(UCVarValue)0xffffffff,CVAR_Int);
    return *(uint32 *)&this_00[1]._vptr_FBaseCVar;
  }
  __assert_fail("color != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/d_netinfo.cpp"
                ,0x1eb,"uint32 userinfo_t::ColorChanged(const char *)");
}

Assistant:

uint32 userinfo_t::ColorChanged(const char *colorname)
{
	FColorCVar *color = static_cast<FColorCVar *>((*this)[NAME_Color]);
	assert(color != NULL);
	UCVarValue val;
	val.String = const_cast<char *>(colorname);
	color->SetGenericRep(val, CVAR_String);
	*static_cast<FIntCVar *>((*this)[NAME_ColorSet]) = -1;
	return *color;
}